

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

char * __thiscall
viennamath::variable_index_out_of_bounds_exception::what
          (variable_index_out_of_bounds_exception *this)

{
  ostream *poVar1;
  void *this_00;
  char *pcVar2;
  string local_1b8 [32];
  stringstream local_198 [8];
  stringstream ss;
  ostream local_188 [376];
  variable_index_out_of_bounds_exception *local_10;
  variable_index_out_of_bounds_exception *this_local;
  
  local_10 = this;
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::operator<<(local_188,
                           "Encountered an variable<> type with id larger or equal to the size of the supplied vector of values. id="
                          );
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->id_);
  poVar1 = std::operator<<(poVar1,", vector_size=");
  this_00 = (void *)std::ostream::operator<<(poVar1,this->vector_size_);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::__cxx11::stringstream::str();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::stringstream::~stringstream(local_198);
  return pcVar2;
}

Assistant:

const char * what() const throw()
    {
      std::stringstream ss;
      ss << "Encountered an variable<> type with id larger or equal to the size of the supplied vector of values. id=" << id_ << ", vector_size=" << vector_size_ << std::endl;
      return ss.str().c_str();
    }